

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O0

void __thiscall flatbuffers::BinaryAnnotator::FixMissingSections(BinaryAnnotator *this)

{
  uint64_t uVar1;
  bool bVar2;
  reference pvVar3;
  reference section_00;
  const_reference pvVar4;
  BinarySection *section_to_insert;
  iterator __end1_1;
  iterator __begin1_1;
  vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_> *__range1_1;
  uint64_t local_c8;
  uint64_t pad_bytes_1;
  BinarySection local_b0;
  uint64_t local_70;
  uint64_t pad_bytes;
  uint64_t section_end_offset;
  uint64_t section_start_offset;
  BinarySection *section;
  pair<const_unsigned_long,_flatbuffers::BinarySection> *current_section;
  iterator __end1;
  iterator __begin1;
  map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
  *__range1;
  vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_> sections_to_insert
  ;
  uint64_t offset;
  BinaryAnnotator *this_local;
  
  sections_to_insert.
  super__Vector_base<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>::vector
            ((vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_> *)
             &__range1);
  __end1 = std::
           map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
           ::begin(&this->sections_);
  current_section =
       (pair<const_unsigned_long,_flatbuffers::BinarySection> *)
       std::
       map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
       ::end(&this->sections_);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&current_section);
    if (!bVar2) break;
    section = (BinarySection *)
              std::_Rb_tree_iterator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>::
              operator*(&__end1);
    section_start_offset = (uint64_t)&((reference)section)->second;
    section_end_offset = ((reference)section)->first;
    pvVar3 = std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
             back(&(((reference)section)->second).regions);
    uVar1 = pvVar3->offset;
    pvVar3 = std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
             back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                  (section_start_offset + 0x28));
    pad_bytes = uVar1 + pvVar3->length;
    if (sections_to_insert.
        super__Vector_base<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage < section_end_offset) {
      local_70 = (section_end_offset -
                 (long)sections_to_insert.
                       super__Vector_base<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage) + 1;
      anon_unknown_46::GenerateMissingSection
                (&local_b0,
                 (uint64_t)
                 ((long)&sections_to_insert.
                         super__Vector_base<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].regions.
                         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),local_70,
                 this->binary_);
      std::vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>::
      push_back((vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_> *)
                &__range1,&local_b0);
      BinarySection::~BinarySection(&local_b0);
    }
    sections_to_insert.
    super__Vector_base<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pad_bytes + 1);
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>::operator++
              (&__end1);
  }
  if (sections_to_insert.
      super__Vector_base<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage < (pointer)this->binary_length_) {
    local_c8 = (this->binary_length_ -
               (long)sections_to_insert.
                     super__Vector_base<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage) + 1;
    anon_unknown_46::GenerateMissingSection
              ((BinarySection *)&__range1_1,
               (uint64_t)
               ((long)&sections_to_insert.
                       super__Vector_base<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].regions.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),local_c8,
               this->binary_);
    std::vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>::push_back
              ((vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_> *)
               &__range1,(value_type *)&__range1_1);
    BinarySection::~BinarySection((BinarySection *)&__range1_1);
  }
  __end1_1 = std::vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>::
             begin((vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>
                    *)&__range1);
  section_to_insert =
       (BinarySection *)
       std::vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>::end
                 ((vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_> *
                  )&__range1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<flatbuffers::BinarySection_*,_std::vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>_>
                        *)&section_to_insert);
    if (!bVar2) break;
    section_00 = __gnu_cxx::
                 __normal_iterator<flatbuffers::BinarySection_*,_std::vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>_>
                 ::operator*(&__end1_1);
    pvVar4 = std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
             operator[](&section_00->regions,0);
    AddSection(this,pvVar4->offset,section_00);
    __gnu_cxx::
    __normal_iterator<flatbuffers::BinarySection_*,_std::vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>_>
    ::operator++(&__end1_1);
  }
  std::vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>::~vector
            ((vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_> *)
             &__range1);
  return;
}

Assistant:

void BinaryAnnotator::FixMissingSections() {
  uint64_t offset = 0;

  std::vector<BinarySection> sections_to_insert;

  for (auto &current_section : sections_) {
    BinarySection &section = current_section.second;
    const uint64_t section_start_offset = current_section.first;
    const uint64_t section_end_offset =
        section.regions.back().offset + section.regions.back().length;

    if (offset < section_start_offset) {
      // We are at an offset that is less then the current section.
      const uint64_t pad_bytes = section_start_offset - offset + 1;

      sections_to_insert.push_back(
          GenerateMissingSection(offset - 1, pad_bytes, binary_));
    }
    offset = section_end_offset + 1;
  }

  // Handle the case where there are still bytes left in the binary that are
  // unaccounted for.
  if (offset < binary_length_) {
    const uint64_t pad_bytes = binary_length_ - offset + 1;
    sections_to_insert.push_back(
        GenerateMissingSection(offset - 1, pad_bytes, binary_));
  }

  for (const BinarySection &section_to_insert : sections_to_insert) {
    AddSection(section_to_insert.regions[0].offset, section_to_insert);
  }
}